

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__readval(stbi__context *s,int channel,stbi_uc *dest)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc *psVar4;
  long lVar5;
  uint uVar6;
  
  psVar1 = s->buffer_start;
  uVar6 = 0x80;
  lVar5 = 0;
  do {
    if ((uVar6 & channel) != 0) {
      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00116f79:
        if (s->img_buffer_end <= s->img_buffer) {
LAB_00117019:
          stbi__g_failure_reason = "PIC file too short";
          return (stbi_uc *)0x0;
        }
      }
      else {
        iVar3 = (*(s->io).eof)(s->io_user_data);
        if (iVar3 != 0) {
          if (s->read_from_callbacks == 0) goto LAB_00117019;
          goto LAB_00116f79;
        }
      }
      psVar4 = s->img_buffer;
      if (psVar4 < s->img_buffer_end) {
LAB_00116ff6:
        s->img_buffer = psVar4 + 1;
        sVar2 = *psVar4;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar3 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar3;
          }
          psVar4 = s->img_buffer;
          goto LAB_00116ff6;
        }
        sVar2 = '\0';
      }
      dest[lVar5] = sVar2;
    }
    lVar5 = lVar5 + 1;
    uVar6 = uVar6 >> 1;
    if (lVar5 == 4) {
      return dest;
    }
  } while( true );
}

Assistant:

static stbi_uc *stbi__readval(stbi__context *s, int channel, stbi_uc *dest)
{
   int mask=0x80, i;

   for (i=0; i<4; ++i, mask>>=1) {
      if (channel & mask) {
         if (stbi__at_eof(s)) return stbi__errpuc("bad file","PIC file too short");
         dest[i]=stbi__get8(s);
      }
   }

   return dest;
}